

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cache.cc
# Opt level: O2

Handle * __thiscall
leveldb::anon_unknown_0::ShardedLRUCache::Lookup(ShardedLRUCache *this,Slice *key)

{
  long lVar1;
  LRUHandle *pLVar2;
  LRUHandle *pLVar3;
  LRUHandle *pLVar4;
  uint32_t uVar5;
  uint uVar6;
  LRUHandle **ppLVar7;
  Mutex *__mutex;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = HashSlice(key);
  uVar6 = uVar5 >> 0x1c;
  __mutex = &this->shard_[uVar6].mutex_;
  std::mutex::lock(&__mutex->mu_);
  ppLVar7 = HandleTable::FindPointer(&this->shard_[uVar6].table_,key,uVar5);
  pLVar2 = *ppLVar7;
  if (pLVar2 != (LRUHandle *)0x0) {
    uVar5 = pLVar2->refs;
    if ((uVar5 == 1) && (pLVar2->in_cache == true)) {
      pLVar3 = pLVar2->next;
      pLVar4 = pLVar2->prev;
      pLVar3->prev = pLVar4;
      pLVar4->next = pLVar3;
      pLVar2->next = &this->shard_[uVar6].in_use_;
      pLVar3 = this->shard_[uVar6].in_use_.prev;
      pLVar2->prev = pLVar3;
      pLVar3->next = pLVar2;
      pLVar2->next->prev = pLVar2;
    }
    pLVar2->refs = uVar5 + 1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    return (Handle *)pLVar2;
  }
  __stack_chk_fail();
}

Assistant:

Handle* Lookup(const Slice& key) override {
    const uint32_t hash = HashSlice(key);
    return shard_[Shard(hash)].Lookup(key, hash);
  }